

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::AddPolySegs(FNodeBuilder *this,FPolySeg *segs,int numsegs)

{
  uint uVar1;
  FPrivVert *pFVar2;
  side_t *side;
  fixed_t local_78;
  int segnum;
  FPrivVert vert;
  FPrivSeg seg;
  int i;
  int numsegs_local;
  FPolySeg *segs_local;
  FNodeBuilder *this_local;
  
  if (numsegs < 1) {
    __assert_fail("numsegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                  ,0xf4,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
  }
  seg.hashnext._0_4_ = 0;
  while( true ) {
    if (numsegs <= (int)seg.hashnext) {
      return;
    }
    if (segs[(int)seg.hashnext].wall == (side_t *)0x0) break;
    local_78 = FloatToFixed(segs[(int)seg.hashnext].v1.pos.X);
    segnum = FloatToFixed(segs[(int)seg.hashnext].v1.pos.Y);
    vert.segs = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_78);
    local_78 = FloatToFixed(segs[(int)seg.hashnext].v2.pos.X);
    segnum = FloatToFixed(segs[(int)seg.hashnext].v2.pos.Y);
    vert.segs2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_78);
    TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
              (&this->Vertices,(long)(int)vert.segs);
    TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
              (&this->Vertices,(long)(int)vert.segs2);
    uVar1 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push
                      (&this->Segs,(FPrivSeg *)&vert.segs);
    pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)(int)vert.segs);
    pFVar2->segs = uVar1;
    pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)(int)vert.segs2);
    pFVar2->segs2 = uVar1;
    seg.hashnext._0_4_ = (int)seg.hashnext + 1;
  }
  __assert_fail("side != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                ,0x105,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
}

Assistant:

void FNodeBuilder::AddPolySegs(FPolySeg *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		side_t *side = segs[i].wall;
		assert(side != NULL);

		seg.frontsector = side->sector;
		seg.backsector = side->linedef->frontsector == side->sector ? side->linedef->backsector : side->linedef->frontsector;
		vert.x = FLOAT2FIXED(segs[i].v1.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v1.pos.Y);
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = FLOAT2FIXED(segs[i].v2.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v2.pos.Y);
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(side->linedef - Level.Lines);
		seg.sidedef = int(side - Level.Sides);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}